

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::PHA_IP(CPU *this)

{
  this->cycles = 3;
  WriteByteToStack(this,this->A);
  return;
}

Assistant:

void CPU::PHA_IP()
{
    cycles = 3;
    WriteByteToStack(A);
}